

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppUTestNamerTests.cpp
# Opt level: O0

Utest * __thiscall
TEST_NamerTestGroup_TestProperNameCaseOnWindows_TestShell::createTest
          (TEST_NamerTestGroup_TestProperNameCaseOnWindows_TestShell *this)

{
  Utest *this_00;
  char *in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  this_00 = (Utest *)operator_new(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0x11931f);
  TEST_NamerTestGroup_TestProperNameCaseOnWindows_Test::
  TEST_NamerTestGroup_TestProperNameCaseOnWindows_Test
            ((TEST_NamerTestGroup_TestProperNameCaseOnWindows_Test *)this_00);
  return this_00;
}

Assistant:

TEST(NamerTestGroup, TestProperNameCaseOnWindows)
{
    if (SystemUtils::isWindowsOs())
    {
        ApprovalTestNamer namer;
        auto test = ApprovalTestNamer::currentTest();
        test.setFileName(StringUtils::toLower(test.getFileName()));
        ApprovalTestNamer::currentTest(&test);
        STRCMP_EQUAL(namer.getFileName().c_str(), "CppUTestNamerTests");
    }
}